

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall
sqvector<SQObjectPtr>::insert(sqvector<SQObjectPtr> *this,SQUnsignedInteger idx,SQObjectPtr *val)

{
  SQUnsignedInteger SVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *local_48;
  SQUnsignedInteger i;
  SQObjectPtr local_30;
  SQObjectPtr *local_20;
  SQObjectPtr *val_local;
  SQUnsignedInteger idx_local;
  sqvector<SQObjectPtr> *this_local;
  
  SVar1 = this->_size;
  local_20 = val;
  val_local = (SQObjectPtr *)idx;
  idx_local = (SQUnsignedInteger)this;
  ::SQObjectPtr::SQObjectPtr(&local_30);
  resize(this,SVar1 + 1,&local_30);
  ::SQObjectPtr::~SQObjectPtr(&local_30);
  pSVar2 = (SQObjectPtr *)this->_size;
  while (local_48 = (SQObjectPtr *)((long)&pSVar2[-1].super_SQObject._unVal + 7),
        val_local < local_48) {
    ::SQObjectPtr::operator=
              (this->_vals + (long)local_48,
               this->_vals + (long)&pSVar2[-1].super_SQObject._unVal.pTable + 6);
    pSVar2 = local_48;
  }
  ::SQObjectPtr::operator=(this->_vals + (long)val_local,local_20);
  return;
}

Assistant:

void insert(SQUnsignedInteger idx, const T& val)
    {
        resize(_size + 1);
        for(SQUnsignedInteger i = _size - 1; i > idx; i--) {
            _vals[i] = _vals[i - 1];
        }
        _vals[idx] = val;
    }